

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O2

natwm_error border_theme_from_config(map *map,char *key,border_theme **result)

{
  natwm_error nVar1;
  border_theme *__ptr;
  config_value **ppcVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar3;
  config_array *local_28;
  config_array *config_value;
  
  uVar3 = 0x104072;
  local_28 = (config_array *)0x0;
  nVar1 = config_find_array(map,key,&local_28);
  if (nVar1 == NO_ERROR) {
    __ptr = border_theme_create();
    if (__ptr == (border_theme *)0x0) {
      nVar1 = MEMORY_ALLOCATION_ERROR;
    }
    else if (local_28->length == 4) {
      ppcVar2 = local_28->values;
      if ((*ppcVar2)->type == NUMBER) {
        __ptr->unfocused = *(uint16_t *)&(*ppcVar2)->data;
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Ignoring invalid unfocused config item inside \'%s\'",key,in_R8,in_R9,uVar3
                       );
        ppcVar2 = local_28->values;
      }
      if (ppcVar2[1]->type == NUMBER) {
        __ptr->focused = *(uint16_t *)&ppcVar2[1]->data;
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Ignoring invalid focused config item inside \'%s\'",key,in_R8,in_R9,uVar3);
        ppcVar2 = local_28->values;
      }
      if (ppcVar2[2]->type == NUMBER) {
        __ptr->urgent = *(uint16_t *)&ppcVar2[2]->data;
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Ignoring invalid urgent config item inside \'%s\'",key,in_R8,in_R9,uVar3);
      }
      if (local_28->values[3]->type == NUMBER) {
        __ptr->sticky = *(uint16_t *)&local_28->values[3]->data;
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Ignoring invalid sticky config item inside \'%s\'",key);
      }
      *result = __ptr;
      nVar1 = NO_ERROR;
    }
    else {
      free(__ptr);
      nVar1 = INVALID_INPUT_ERROR;
    }
  }
  else if (nVar1 == NOT_FOUND_ERROR) {
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find config item for \'%s\'",key,in_R8,in_R9
                    ,uVar3);
    nVar1 = NOT_FOUND_ERROR;
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find border widths for config item \'%s\'",
                    key,in_R8,in_R9,uVar3);
  }
  return nVar1;
}

Assistant:

enum natwm_error border_theme_from_config(const struct map *map, const char *key,
                                          struct border_theme **result)
{
        const struct config_array *config_value = NULL;
        enum natwm_error err = config_find_array(map, key, &config_value);

        if (err != NO_ERROR) {
                if (err == NOT_FOUND_ERROR) {
                        LOG_ERROR(natwm_logger, "Failed to find config item for '%s'", key);
                } else {
                        LOG_ERROR(natwm_logger,
                                  "Failed to find border widths for config "
                                  "item '%s'",
                                  key);
                }

                return err;
        }

        struct border_theme *theme = border_theme_create();

        if (theme == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        if (config_value->length != 4) {
                border_theme_destroy(theme);

                return INVALID_INPUT_ERROR;
        }

        const struct config_value *unfocused_value = config_value->values[0];

        if (unfocused_value->type != NUMBER) {
                LOG_WARNING(
                        natwm_logger, "Ignoring invalid unfocused config item inside '%s'", key);
        } else {
                theme->unfocused = (uint16_t)unfocused_value->data.number;
        }

        const struct config_value *focused_value = config_value->values[1];

        if (focused_value->type != NUMBER) {
                LOG_WARNING(natwm_logger, "Ignoring invalid focused config item inside '%s'", key);
        } else {
                theme->focused = (uint16_t)focused_value->data.number;
        }

        const struct config_value *urgent_value = config_value->values[2];

        if (urgent_value->type != NUMBER) {
                LOG_WARNING(natwm_logger, "Ignoring invalid urgent config item inside '%s'", key);
        } else {
                theme->urgent = (uint16_t)urgent_value->data.number;
        }

        const struct config_value *sticky_value = config_value->values[3];

        if (sticky_value->type != NUMBER) {
                LOG_WARNING(natwm_logger, "Ignoring invalid sticky config item inside '%s'", key);
        } else {
                theme->sticky = (uint16_t)sticky_value->data.number;
        }

        *result = theme;

        return NO_ERROR;
}